

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

bool __thiscall
Memory::Recycler::ExplicitFreeInternalWrapper<(Memory::ObjectInfoBits)0>
          (Recycler *this,void *buffer,size_t size)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  size_t sVar4;
  undefined8 *in_FS_OFFSET;
  
  if (buffer == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x484,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar3) goto LAB_00294a94;
    *puVar1 = 0;
  }
  if (size == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x485,"(size > 0)","size > 0");
    if (!bVar3) {
LAB_00294a94:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  bVar3 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Off,ExplicitFreePhase);
  if (!bVar3) {
    sVar4 = GetAllocSize(this,size);
    if (sVar4 < 0x301) {
      bVar3 = ExplicitFreeInternal<(Memory::ObjectInfoBits)0,SmallAllocationBlockAttributes>
                        (this,buffer,size,(ulong)((int)sVar4 + 0xfU & 0x7f0));
      return bVar3;
    }
    if (sVar4 - 0x301 < 0x1d00) {
      bVar3 = ExplicitFreeInternal<(Memory::ObjectInfoBits)0,MediumAllocationBlockAttributes>
                        (this,buffer,size,(ulong)((int)sVar4 + 0xffU & 0x7f00));
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool Recycler::ExplicitFreeInternalWrapper(void* buffer, size_t size)
{
    Assert(buffer != nullptr);
    Assert(size > 0);

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    if (CUSTOM_PHASE_OFF1(GetRecyclerFlagsTable(), Js::ExplicitFreePhase))
    {
        return false;
    }
#endif

    size_t allocSize = GetAllocSize(size);

    if (HeapInfo::IsSmallObject(allocSize))
    {
        return ExplicitFreeInternal<attributes, SmallAllocationBlockAttributes>(buffer, size, HeapInfo::GetAlignedSizeNoCheck(allocSize));
    }

    if (HeapInfo::IsMediumObject(allocSize))
    {
        return ExplicitFreeInternal<attributes, MediumAllocationBlockAttributes>(buffer, size, HeapInfo::GetMediumObjectAlignedSizeNoCheck(allocSize));
    }

    return false;
}